

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::setEBDirichlet
          (MLEBABecLap *this,int amrlev,MultiFab *phi,
          Vector<double,_std::allocator<double>_> *hv_beta)

{
  Location LVar1;
  pointer puVar2;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> tVar3;
  long *plVar4;
  pointer __src;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  uint uVar5;
  MLEBABecLap *pMVar6;
  undefined8 uVar7;
  FabType FVar8;
  EBFArrayBoxFactory *this_01;
  pointer *ppbVar9;
  ulong uVar10;
  size_t __n;
  long lVar11;
  Vector<double,_std::allocator<double>_> *pVVar12;
  long lVar13;
  int mglev;
  uint32_t *puVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  element_type *peVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  Periodicity PVar21;
  int ncomp;
  int ngrow;
  MFIter mfi;
  DeviceVector<Real> dv_beta;
  uint local_284;
  Vector<double,_std::allocator<double>_> *local_280;
  FabArray<amrex::EBCellFlagFab> *local_278;
  long local_270;
  MLEBABecLap *local_268;
  long local_260;
  long local_258;
  long local_250;
  ulong local_248;
  long local_240;
  ulong local_238;
  long local_230;
  long local_228;
  long local_220;
  Location local_218;
  Box local_214;
  undefined1 local_1f8 [80];
  Array4<double> local_1a8;
  ulong local_168;
  long local_160;
  long local_158;
  long local_150;
  pointer local_148;
  undefined1 local_140 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_130;
  int local_118;
  Vector<int,_std::allocator<int>_> *local_100;
  PODVector<double,_std::allocator<double>_> local_e0;
  Array4<const_double> local_c8;
  Array4<const_amrex::EBCellFlag> local_88;
  MFItInfo local_44;
  
  local_1f8._64_8_ = phi;
  local_284 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  LVar1 = this->m_phi_loc;
  lVar15 = (long)amrlev;
  local_268 = this;
  if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)
      *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
       &(this->m_eb_phi).
        super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        .
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> ==
      (MultiFab *)0x0) {
    local_1a8.p._0_4_ = (uint)(LVar1 == CellCentroid);
    local_140._1_7_ = 0;
    local_140[0] = 1;
    local_140._8_4_ = 0;
    local_140._12_4_ = 0;
    vStack_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_130.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int_const&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)local_1f8,
               *(DistributionMapping **)
                &(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_grids.
                 super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar15].
                 super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               *(int **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_dmap.
                         super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar15].
                         super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         .
                         super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
               ,(int *)&local_284,(MFInfo *)(local_1f8 + 0x50),
               (FabFactory<amrex::FArrayBox> *)local_140);
    uVar7 = local_1f8._0_8_;
    puVar2 = (this->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1f8._0_8_ = (double *)0x0;
    tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
          &puVar2[lVar15]._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    puVar2[lVar15]._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> =
         (__uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>)uVar7;
    if (tVar3.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
      (**(code **)(*(long *)tVar3.
                            super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                            .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 8))();
    }
    if ((double *)local_1f8._0_8_ != (double *)0x0) {
      (**(code **)((long)*(double *)local_1f8._0_8_ + 8))();
    }
    local_1f8._0_8_ = (MultiFab *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_130);
  }
  peVar18 = (element_type *)(lVar15 * 0x18);
  local_280 = hv_beta;
  local_258 = lVar15;
  local_218 = LVar1;
  if (**(long **)((long)&(((local_268->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (long)(&(peVar18->bbox).smallend + -2)) == 0) {
    lVar16 = 0;
    lVar15 = 0;
    for (lVar11 = 0; pMVar6 = local_268,
        lVar11 < (local_268->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_mg_levels.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_258]; lVar11 = lVar11 + 1) {
      local_1a8.p._0_4_ = 0;
      local_140._1_7_ = 0;
      local_140[0] = 1;
      vStack_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_140._8_4_ = 0;
      local_140._12_4_ = 0;
      vStack_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)local_1f8,
                 (DistributionMapping *)
                 (*(long *)((long)&(((local_268->super_MLCellABecLap).super_MLCellLinOp.
                                     super_MLLinOp.m_grids.
                                     super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start +
                           (long)(&(peVar18->bbox).smallend + -2)) + lVar15),
                 (int *)(*(long *)((long)&(((local_268->super_MLCellABecLap).super_MLCellLinOp.
                                            super_MLLinOp.m_dmap.
                                            super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            .
                                            super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ).
                                          super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (long)(&(peVar18->bbox).smallend + -2)) + lVar16),
                 (int *)&local_284,(MFInfo *)(local_1f8 + 0x50),
                 (FabFactory<amrex::FArrayBox> *)local_140);
      uVar7 = local_1f8._0_8_;
      lVar13 = *(long *)((long)&(((pMVar6->m_eb_b_coeffs).
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                ).
                                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                        (long)(&(peVar18->bbox).smallend + -2));
      local_1f8._0_8_ = (double *)0x0;
      plVar4 = *(long **)(lVar13 + lVar11 * 8);
      *(undefined8 *)(lVar13 + lVar11 * 8) = uVar7;
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))();
      }
      if ((double *)local_1f8._0_8_ != (double *)0x0) {
        (**(code **)((long)*(double *)local_1f8._0_8_ + 8))();
      }
      local_1f8._0_8_ = (MultiFab *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_130);
      lVar15 = lVar15 + 0x68;
      lVar16 = lVar16 + 0x10;
    }
  }
  lVar15 = **(long **)((long)&(((local_268->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                                m_factory.
                                super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              ).
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (long)(&(peVar18->bbox).smallend + -2));
  local_1f8._72_8_ = peVar18;
  if (lVar15 == 0) {
    local_278 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    pVVar12 = local_280;
  }
  else {
    local_278 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    this_01 = (EBFArrayBoxFactory *)
              __dynamic_cast(lVar15,&FabFactory<amrex::FArrayBox>::typeinfo,
                             &EBFArrayBoxFactory::typeinfo,0);
    pVVar12 = local_280;
    if (this_01 != (EBFArrayBoxFactory *)0x0) {
      local_278 = EBFArrayBoxFactory::getMultiEBCellFlagFab(this_01);
    }
  }
  PODVector<double,_std::allocator<double>_>::PODVector
            (&local_e0,
             (long)(pVVar12->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pVVar12->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  __src = (pVVar12->super_vector<double,_std::allocator<double>_>).
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)(pVVar12->super_vector<double,_std::allocator<double>_>).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)__src;
  if (__n != 0) {
    memcpy(local_e0.m_data,__src,__n);
  }
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.do_tiling = true;
  local_44.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_44.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_44.tilesize.vect[2] = DAT_006ddef0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter((MFIter *)local_140,(FabArrayBase *)local_1f8._64_8_,&local_44);
  local_148 = local_e0.m_data;
  do {
    if (local_118 <=
        (int)vStack_130.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      MFIter::~MFIter((MFIter *)local_140);
      if (local_218 == CellCentroid) {
        this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (local_268->m_eb_phi).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_258]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
        PVar21 = Geometry::periodicity
                           (*(Geometry **)
                             ((long)&(((local_268->super_MLCellABecLap).super_MLCellLinOp.
                                       super_MLLinOp.m_geom.
                                       super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       .
                                       super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ).
                                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (long)(&((Box *)(local_1f8._72_8_ + 0x18))->smallend + -2)));
        local_140[0] = (undefined1)PVar21.period.vect[0];
        local_140._1_7_ = PVar21.period.vect._1_7_;
        local_140._8_4_ = PVar21.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>
                  ((FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (Periodicity *)local_140,false);
      }
      PODVector<double,_std::allocator<double>_>::~PODVector(&local_e0);
      return;
    }
    MFIter::tilebox(&local_214,(MFIter *)local_140);
    pMVar6 = local_268;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)local_1f8,
               (FabArray<amrex::FArrayBox> *)
               (local_268->m_eb_phi).
               super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_258]._M_t.
               super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
               (MFIter *)local_140);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)(local_1f8 + 0x50),
               (FabArray<amrex::FArrayBox> *)
               **(undefined8 **)
                 ((long)&(((pMVar6->m_eb_b_coeffs).
                           super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ).
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                 (long)(&((Box *)(local_1f8._72_8_ + 0x18))->smallend + -2)),(MFIter *)local_140);
    if (local_278 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_00570cca:
      local_280 = (Vector<double,_std::allocator<double>_> *)(long)local_214.smallend.vect[1];
      local_250 = (long)local_214.smallend.vect[2];
      local_230 = CONCAT44(local_230._4_4_,local_214.bigend.vect[2]);
      uVar5 = local_284;
      if ((int)local_284 < 1) {
        uVar5 = 0;
      }
      local_248 = (ulong)uVar5;
      local_240 = (long)local_214.smallend.vect[0] * 8;
      local_270 = 0;
      uVar17 = 0;
      while (uVar10 = uVar17, lVar15 = local_250, uVar10 != local_248) {
        for (; (int)lVar15 <= local_214.bigend.vect[2]; lVar15 = lVar15 + 1) {
          local_220 = (long)(int)local_1f8._32_4_;
          local_228 = (long)(int)local_1f8._36_4_;
          local_260 = (long)(int)local_1f8._40_4_;
          lVar11 = local_1a8.nstride * local_270 +
                   ((long)local_280 - (long)local_1a8.begin.y) * local_1a8.jstride * 8 +
                   (lVar15 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                   (long)local_1a8.begin.x * -8 +
                   CONCAT44(local_1a8.p._4_4_,(uint)local_1a8.p) + local_240;
          lVar16 = local_1f8._0_8_ +
                   local_1f8._24_8_ * local_270 +
                   ((long)local_280 - local_228) * local_1f8._8_8_ * 8 +
                   (lVar15 - local_260) * local_1f8._16_8_ * 8 + local_220 * -8 + local_240;
          for (pVVar12 = local_280; (long)pVVar12 <= (long)local_214.bigend.vect[1];
              pVVar12 = (Vector<double,_std::allocator<double>_> *)
                        ((long)&(pVVar12->super_vector<double,_std::allocator<double>_>).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + 1)) {
            if (local_214.smallend.vect[0] <= local_214.bigend.vect[0]) {
              lVar13 = 0;
              do {
                *(undefined8 *)(lVar16 + lVar13 * 8) = 0;
                *(undefined8 *)(lVar11 + lVar13 * 8) = 0;
                lVar13 = lVar13 + 1;
              } while ((local_214.bigend.vect[0] - local_214.smallend.vect[0]) + 1 != (int)lVar13);
            }
            lVar11 = lVar11 + local_1a8.jstride * 8;
            lVar16 = lVar16 + local_1f8._8_8_ * 8;
          }
        }
        local_270 = local_270 + 8;
        local_238 = uVar10;
        uVar17 = uVar10 + 1;
      }
    }
    else {
      ppbVar9 = &vStack_130.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_100 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar9 = (pointer *)
                  ((local_100->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)vStack_130.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      FVar8 = EBCellFlagFab::getType
                        ((local_278->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar9],&local_214);
      if ((uint)(FVar8 + singlevalued) < 2) goto LAB_00570cca;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_c8,(FabArray<amrex::FArrayBox> *)local_1f8._64_8_,(MFIter *)local_140);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_88,local_278,(MFIter *)local_140);
      local_240 = (long)local_214.smallend.vect[0];
      local_150 = (long)local_214.smallend.vect[1];
      local_160 = (long)local_214.smallend.vect[2];
      local_250 = CONCAT44(local_250._4_4_,local_214.bigend.vect[2]);
      uVar5 = local_284;
      if ((int)local_284 < 1) {
        uVar5 = 0;
      }
      local_168 = (ulong)uVar5;
      local_248 = local_240 * 8;
      local_158 = local_240 * 4;
      local_270 = 0;
      local_238 = CONCAT44(local_238._4_4_,local_214.bigend.vect[0]);
      for (uVar17 = 0; lVar15 = local_160, uVar17 != local_168; uVar17 = uVar17 + 1) {
        while (lVar11 = lVar15, (int)lVar11 <= local_214.bigend.vect[2]) {
          local_230 = local_88.jstride * 4;
          puVar14 = (uint32_t *)
                    ((long)&local_88.p
                            [local_240 +
                             ((lVar11 - local_88.begin.z) * local_88.kstride -
                             (long)local_88.begin.x)].flag +
                    (local_150 - local_88.begin.y) * local_230);
          for (lVar15 = local_150; lVar15 <= local_214.bigend.vect[1]; lVar15 = lVar15 + 1) {
            if (local_214.smallend.vect[0] <= local_214.bigend.vect[0]) {
              local_228 = (long)(int)local_1f8._36_4_;
              local_280 = (Vector<double,_std::allocator<double>_> *)(long)local_c8.begin.y;
              local_220 = (long)local_c8.begin.z;
              lVar16 = local_1f8._24_8_ * local_270 +
                       (lVar15 - local_228) * local_1f8._8_8_ * 8 +
                       (lVar11 - (int)local_1f8._40_4_) * local_1f8._16_8_ * 8 +
                       (long)(int)local_1f8._32_4_ * -8 + local_248;
              lVar13 = 0;
              do {
                if ((puVar14[lVar13] & 3) == 1) {
                  *(undefined8 *)(local_1f8._0_8_ + lVar13 * 8 + lVar16) =
                       *(undefined8 *)
                        ((long)local_c8.p +
                        lVar13 * 8 +
                        local_c8.nstride * local_270 +
                        (lVar15 - (long)local_280) * local_c8.jstride * 8 +
                        (lVar11 - local_220) * local_c8.kstride * 8 + (long)local_c8.begin.x * -8 +
                        local_248);
                  uVar19 = SUB84(local_148[uVar17],0);
                  uVar20 = (undefined4)((ulong)local_148[uVar17] >> 0x20);
                }
                else {
                  *(undefined8 *)(local_1f8._0_8_ + lVar13 * 8 + lVar16) = 0;
                  uVar19 = 0;
                  uVar20 = 0;
                }
                *(ulong *)(local_1a8.nstride * local_270 +
                           (lVar15 - local_1a8.begin.y) * local_1a8.jstride * 8 +
                           (lVar11 - local_1a8.begin.z) * local_1a8.kstride * 8 +
                           (long)local_1a8.begin.x * -8 +
                           CONCAT44(local_1a8.p._4_4_,(uint)local_1a8.p) + local_248 + lVar13 * 8) =
                     CONCAT44(uVar20,uVar19);
                lVar13 = lVar13 + 1;
              } while ((local_214.bigend.vect[0] - local_214.smallend.vect[0]) + 1 != (int)lVar13);
            }
            puVar14 = puVar14 + local_88.jstride;
          }
          local_260 = lVar11;
          lVar15 = lVar11 + 1;
        }
        local_270 = local_270 + 8;
      }
    }
    MFIter::operator++((MFIter *)local_140);
  } while( true );
}

Assistant:

void
MLEBABecLap::setEBDirichlet (int amrlev, const MultiFab& phi, Vector<Real> const& hv_beta)
{
    const int ncomp = getNComp();
    bool phi_on_centroid = (m_phi_loc == Location::CellCentroid);
    if (m_eb_phi[amrlev] == nullptr) {
        const int mglev = 0;
        const int ngrow = phi_on_centroid ? 1 : 0;
        m_eb_phi[amrlev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                      m_dmap[amrlev][mglev],
                                                      ncomp, ngrow, MFInfo(),
                                                      *m_factory[amrlev][mglev]);
    }
    if (m_eb_b_coeffs[amrlev][0] == nullptr) {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev) {
            m_eb_b_coeffs[amrlev][mglev] = std::make_unique<MultiFab>(m_grids[amrlev][mglev],
                                                                      m_dmap[amrlev][mglev],
                                                                      ncomp, 0, MFInfo(),
                                                                      *m_factory[amrlev][mglev]);
        }
    }

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    Gpu::DeviceVector<Real> dv_beta(hv_beta.size());
    Gpu::copy(Gpu::hostToDevice, hv_beta.begin(), hv_beta.end(), dv_beta.begin());
    Real const* beta = dv_beta.data();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(phi, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& phiout = m_eb_phi[amrlev]->array(mfi);
        Array4<Real> const& betaout = m_eb_b_coeffs[amrlev][0]->array(mfi);
        FabType t = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;
        if (FabType::regular == t || FabType::covered == t) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                phiout(i,j,k,n) = 0.0;
                betaout(i,j,k,n) = 0.0;
            });
        } else {
            Array4<Real const> const& phiin = phi.const_array(mfi);
            const auto& flag = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flag(i,j,k).isSingleValued()) {
                    phiout(i,j,k,n) = phiin(i,j,k,n);
                    betaout(i,j,k,n) = beta[n];
                } else {
                    phiout(i,j,k,n) = 0.0;
                    betaout(i,j,k,n) = 0.0;
                }
            });
        }
    }

    if (phi_on_centroid)
      m_eb_phi[amrlev]->FillBoundary(m_geom[amrlev][0].periodicity());
}